

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void iadst8x8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar15;
  int iVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar25;
  int iVar28;
  undefined1 auVar23 [16];
  int iVar21;
  uint uVar22;
  int iVar26;
  uint uVar27;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  undefined1 auVar24 [16];
  int iVar34;
  uint uVar35;
  int iVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  __m128i offset_2;
  undefined1 auVar36 [16];
  int iVar41;
  uint uVar42;
  int iVar43;
  int iVar45;
  int iVar46;
  undefined1 auVar44 [16];
  int iVar47;
  int iVar48;
  int iVar52;
  int iVar54;
  undefined1 auVar50 [16];
  uint uVar49;
  uint uVar53;
  uint uVar55;
  int iVar56;
  uint uVar57;
  undefined1 auVar51 [16];
  uint uVar58;
  uint uVar61;
  uint uVar62;
  undefined1 auVar59 [16];
  uint uVar63;
  undefined1 auVar60 [16];
  uint uVar64;
  uint uVar65;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  undefined1 auVar66 [16];
  uint uVar72;
  uint uVar73;
  uint uVar75;
  uint uVar76;
  __m128i offset;
  undefined1 auVar74 [16];
  uint uVar77;
  undefined1 auVar78 [16];
  int iVar79;
  int iVar81;
  int iVar82;
  undefined1 auVar80 [16];
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  uint uVar89;
  int iVar90;
  int iVar94;
  int iVar96;
  int iVar97;
  int iVar99;
  undefined1 auVar91 [16];
  int iVar100;
  int iVar101;
  undefined1 auVar92 [16];
  uint uVar95;
  uint uVar98;
  uint uVar102;
  undefined1 auVar93 [16];
  int iVar103;
  
  auVar14._8_4_ = 0xfec;
  auVar14._0_8_ = 0xfec00000fec;
  auVar14._12_4_ = 0xfec;
  auVar78._8_4_ = 0x191;
  auVar78._0_8_ = 0x19100000191;
  auVar78._12_4_ = 0x191;
  auVar24._8_4_ = 0xe1c;
  auVar24._0_8_ = 0xe1c00000e1c;
  auVar24._12_4_ = 0xe1c;
  auVar51._8_4_ = 0x78b;
  auVar51._0_8_ = 0x78b0000078b;
  auVar51._12_4_ = 0x78b;
  auVar59._8_4_ = 0xa26;
  auVar59._0_8_ = 0xa2600000a26;
  auVar59._12_4_ = 0xa26;
  auVar66._8_4_ = 0xc5e;
  auVar66._0_8_ = 0xc5e00000c5e;
  auVar66._12_4_ = 0xc5e;
  auVar74._8_4_ = 0x4a5;
  auVar74._0_8_ = 0x4a5000004a5;
  auVar74._12_4_ = 0x4a5;
  auVar44._8_4_ = 0xf50;
  auVar44._0_8_ = 0xf5000000f50;
  auVar44._12_4_ = 0xf50;
  auVar2 = pmulld((undefined1  [16])in[0xe],auVar14);
  auVar8 = pmulld(auVar14,(undefined1  [16])*in);
  auVar36 = pmulld((undefined1  [16])*in,auVar78);
  auVar91 = pmulld((undefined1  [16])in[0xe],auVar78);
  auVar3 = pmulld((undefined1  [16])in[10],auVar24);
  auVar9 = pmulld(auVar24,(undefined1  [16])in[4]);
  auVar80 = pmulld((undefined1  [16])in[4],auVar51);
  auVar50 = pmulld((undefined1  [16])in[10],auVar51);
  auVar4 = pmulld((undefined1  [16])in[6],auVar59);
  auVar23 = pmulld((undefined1  [16])in[8],auVar66);
  auVar7 = pmulld((undefined1  [16])in[6],auVar66);
  auVar12 = pmulld((undefined1  [16])in[8],auVar59);
  auVar5 = pmulld((undefined1  [16])in[2],auVar74);
  auVar18 = pmulld((undefined1  [16])in[0xc],auVar44);
  auVar10 = pmulld((undefined1  [16])in[2],auVar44);
  auVar13 = pmulld((undefined1  [16])in[0xc],auVar74);
  auVar6 = pmovsxwd(auVar5,0x800080008000800);
  iVar90 = auVar6._0_4_;
  iVar96 = auVar6._4_4_;
  iVar99 = auVar6._8_4_;
  iVar103 = auVar6._12_4_;
  iVar34 = auVar36._0_4_ + auVar2._0_4_ + iVar90 >> 0xc;
  iVar37 = auVar36._4_4_ + auVar2._4_4_ + iVar96 >> 0xc;
  iVar39 = auVar36._8_4_ + auVar2._8_4_ + iVar99 >> 0xc;
  iVar41 = auVar36._12_4_ + auVar2._12_4_ + iVar103 >> 0xc;
  iVar20 = auVar23._0_4_ + auVar4._0_4_ + iVar90 >> 0xc;
  iVar25 = auVar23._4_4_ + auVar4._4_4_ + iVar96 >> 0xc;
  iVar28 = auVar23._8_4_ + auVar4._8_4_ + iVar99 >> 0xc;
  iVar31 = auVar23._12_4_ + auVar4._12_4_ + iVar103 >> 0xc;
  iVar11 = iVar20 + iVar34;
  iVar15 = iVar25 + iVar37;
  iVar16 = iVar28 + iVar39;
  iVar17 = iVar31 + iVar41;
  iVar34 = iVar34 - iVar20;
  iVar37 = iVar37 - iVar25;
  iVar39 = iVar39 - iVar28;
  iVar41 = iVar41 - iVar31;
  iVar88 = (auVar91._0_4_ - auVar8._0_4_) + iVar90 >> 0xc;
  iVar94 = (auVar91._4_4_ - auVar8._4_4_) + iVar96 >> 0xc;
  iVar97 = (auVar91._8_4_ - auVar8._8_4_) + iVar99 >> 0xc;
  iVar100 = (auVar91._12_4_ - auVar8._12_4_) + iVar103 >> 0xc;
  iVar20 = (auVar7._0_4_ - auVar12._0_4_) + iVar90 >> 0xc;
  iVar25 = (auVar7._4_4_ - auVar12._4_4_) + iVar96 >> 0xc;
  iVar28 = (auVar7._8_4_ - auVar12._8_4_) + iVar99 >> 0xc;
  iVar31 = (auVar7._12_4_ - auVar12._12_4_) + iVar103 >> 0xc;
  iVar84 = iVar20 + iVar88;
  iVar85 = iVar25 + iVar94;
  iVar86 = iVar28 + iVar97;
  iVar87 = iVar31 + iVar100;
  iVar88 = iVar88 - iVar20;
  iVar94 = iVar94 - iVar25;
  iVar97 = iVar97 - iVar28;
  iVar100 = iVar100 - iVar31;
  iVar25 = do_cols + 6 + (uint)(bit == 0) * 2;
  iVar79 = auVar80._0_4_ + auVar3._0_4_ + iVar90 >> 0xc;
  iVar81 = auVar80._4_4_ + auVar3._4_4_ + iVar96 >> 0xc;
  iVar82 = auVar80._8_4_ + auVar3._8_4_ + iVar99 >> 0xc;
  iVar83 = auVar80._12_4_ + auVar3._12_4_ + iVar103 >> 0xc;
  iVar20 = auVar18._0_4_ + auVar5._0_4_ + iVar90 >> 0xc;
  iVar28 = auVar18._4_4_ + auVar5._4_4_ + iVar96 >> 0xc;
  iVar31 = auVar18._8_4_ + auVar5._8_4_ + iVar99 >> 0xc;
  iVar19 = auVar18._12_4_ + auVar5._12_4_ + iVar103 >> 0xc;
  iVar21 = iVar20 + iVar79;
  iVar26 = iVar28 + iVar81;
  iVar29 = iVar31 + iVar82;
  iVar32 = iVar19 + iVar83;
  iVar79 = iVar79 - iVar20;
  iVar81 = iVar81 - iVar28;
  iVar82 = iVar82 - iVar31;
  iVar83 = iVar83 - iVar19;
  iVar20 = 0x8000;
  if (0xf < iVar25) {
    iVar20 = 1 << ((char)iVar25 - 1U & 0x1f);
  }
  iVar48 = (auVar50._0_4_ - auVar9._0_4_) + iVar90 >> 0xc;
  iVar52 = (auVar50._4_4_ - auVar9._4_4_) + iVar96 >> 0xc;
  iVar54 = (auVar50._8_4_ - auVar9._8_4_) + iVar99 >> 0xc;
  iVar56 = (auVar50._12_4_ - auVar9._12_4_) + iVar103 >> 0xc;
  iVar25 = (auVar10._0_4_ - auVar13._0_4_) + iVar90 >> 0xc;
  iVar28 = (auVar10._4_4_ - auVar13._4_4_) + iVar96 >> 0xc;
  iVar31 = (auVar10._8_4_ - auVar13._8_4_) + iVar99 >> 0xc;
  iVar19 = (auVar10._12_4_ - auVar13._12_4_) + iVar103 >> 0xc;
  iVar43 = iVar25 + iVar48;
  iVar45 = iVar28 + iVar52;
  iVar46 = iVar31 + iVar54;
  iVar47 = iVar19 + iVar56;
  iVar48 = iVar48 - iVar25;
  iVar52 = iVar52 - iVar28;
  iVar54 = iVar54 - iVar31;
  iVar56 = iVar56 - iVar19;
  iVar25 = -iVar20;
  iVar20 = iVar20 + -1;
  auVar10._8_4_ = 0x61f;
  auVar10._0_8_ = 0x61f0000061f;
  auVar10._12_4_ = 0x61f;
  uVar35 = (uint)(iVar34 < iVar25) * iVar25 | (uint)(iVar34 >= iVar25) * iVar34;
  uVar38 = (uint)(iVar37 < iVar25) * iVar25 | (uint)(iVar37 >= iVar25) * iVar37;
  uVar40 = (uint)(iVar39 < iVar25) * iVar25 | (uint)(iVar39 >= iVar25) * iVar39;
  uVar42 = (uint)(iVar41 < iVar25) * iVar25 | (uint)(iVar41 >= iVar25) * iVar41;
  auVar3._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar3._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar3._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar3._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar35 = (uint)(iVar88 < iVar25) * iVar25 | (uint)(iVar88 >= iVar25) * iVar88;
  uVar38 = (uint)(iVar94 < iVar25) * iVar25 | (uint)(iVar94 >= iVar25) * iVar94;
  uVar40 = (uint)(iVar97 < iVar25) * iVar25 | (uint)(iVar97 >= iVar25) * iVar97;
  uVar42 = (uint)(iVar100 < iVar25) * iVar25 | (uint)(iVar100 >= iVar25) * iVar100;
  auVar13._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar13._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar13._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar13._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  auVar9._8_4_ = 0xec8;
  auVar9._0_8_ = 0xec800000ec8;
  auVar9._12_4_ = 0xec8;
  auVar2 = pmulld(auVar3,auVar9);
  auVar6 = pmulld(auVar9,auVar13);
  auVar13 = pmulld(auVar13,auVar10);
  auVar4 = pmulld(auVar3,auVar10);
  auVar7._8_4_ = 0xfffff9e1;
  auVar7._0_8_ = 0xfffff9e1fffff9e1;
  auVar7._12_4_ = 0xfffff9e1;
  uVar35 = (uint)(iVar79 < iVar25) * iVar25 | (uint)(iVar79 >= iVar25) * iVar79;
  uVar38 = (uint)(iVar81 < iVar25) * iVar25 | (uint)(iVar81 >= iVar25) * iVar81;
  uVar40 = (uint)(iVar82 < iVar25) * iVar25 | (uint)(iVar82 >= iVar25) * iVar82;
  uVar42 = (uint)(iVar83 < iVar25) * iVar25 | (uint)(iVar83 >= iVar25) * iVar83;
  auVar12._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar12._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar12._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar12._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar35 = (uint)(iVar48 < iVar25) * iVar25 | (uint)(iVar48 >= iVar25) * iVar48;
  uVar38 = (uint)(iVar52 < iVar25) * iVar25 | (uint)(iVar52 >= iVar25) * iVar52;
  uVar40 = (uint)(iVar54 < iVar25) * iVar25 | (uint)(iVar54 >= iVar25) * iVar54;
  uVar42 = (uint)(iVar56 < iVar25) * iVar25 | (uint)(iVar56 >= iVar25) * iVar56;
  auVar5._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar5._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar5._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar5._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  auVar3 = pmulld(auVar12,auVar7);
  auVar8 = pmulld(auVar7,auVar5);
  auVar5 = pmulld(auVar5,auVar9);
  auVar12 = pmulld(auVar12,auVar9);
  uVar35 = (uint)(iVar11 < iVar25) * iVar25 | (uint)(iVar11 >= iVar25) * iVar11;
  uVar38 = (uint)(iVar15 < iVar25) * iVar25 | (uint)(iVar15 >= iVar25) * iVar15;
  uVar40 = (uint)(iVar16 < iVar25) * iVar25 | (uint)(iVar16 >= iVar25) * iVar16;
  uVar42 = (uint)(iVar17 < iVar25) * iVar25 | (uint)(iVar17 >= iVar25) * iVar17;
  uVar35 = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  uVar38 = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  uVar40 = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  uVar42 = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar22 = (uint)(iVar21 < iVar25) * iVar25 | (uint)(iVar21 >= iVar25) * iVar21;
  uVar27 = (uint)(iVar26 < iVar25) * iVar25 | (uint)(iVar26 >= iVar25) * iVar26;
  uVar30 = (uint)(iVar29 < iVar25) * iVar25 | (uint)(iVar29 >= iVar25) * iVar29;
  uVar33 = (uint)(iVar32 < iVar25) * iVar25 | (uint)(iVar32 >= iVar25) * iVar32;
  uVar22 = (uint)(iVar20 < (int)uVar22) * iVar20 | (iVar20 >= (int)uVar22) * uVar22;
  uVar27 = (uint)(iVar20 < (int)uVar27) * iVar20 | (iVar20 >= (int)uVar27) * uVar27;
  uVar30 = (uint)(iVar20 < (int)uVar30) * iVar20 | (iVar20 >= (int)uVar30) * uVar30;
  uVar33 = (uint)(iVar20 < (int)uVar33) * iVar20 | (iVar20 >= (int)uVar33) * uVar33;
  iVar28 = uVar22 + uVar35;
  iVar31 = uVar27 + uVar38;
  iVar11 = uVar30 + uVar40;
  iVar15 = uVar33 + uVar42;
  iVar16 = uVar35 - uVar22;
  iVar17 = uVar38 - uVar27;
  iVar19 = uVar40 - uVar30;
  iVar21 = uVar42 - uVar33;
  uVar35 = (uint)(iVar84 < iVar25) * iVar25 | (uint)(iVar84 >= iVar25) * iVar84;
  uVar38 = (uint)(iVar85 < iVar25) * iVar25 | (uint)(iVar85 >= iVar25) * iVar85;
  uVar40 = (uint)(iVar86 < iVar25) * iVar25 | (uint)(iVar86 >= iVar25) * iVar86;
  uVar42 = (uint)(iVar87 < iVar25) * iVar25 | (uint)(iVar87 >= iVar25) * iVar87;
  uVar22 = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  uVar27 = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  uVar30 = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  uVar33 = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar35 = (uint)(iVar43 < iVar25) * iVar25 | (uint)(iVar43 >= iVar25) * iVar43;
  uVar38 = (uint)(iVar45 < iVar25) * iVar25 | (uint)(iVar45 >= iVar25) * iVar45;
  uVar40 = (uint)(iVar46 < iVar25) * iVar25 | (uint)(iVar46 >= iVar25) * iVar46;
  uVar42 = (uint)(iVar47 < iVar25) * iVar25 | (uint)(iVar47 >= iVar25) * iVar47;
  uVar35 = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  uVar38 = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  uVar40 = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  uVar42 = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  iVar85 = uVar35 + uVar22;
  iVar86 = uVar38 + uVar27;
  iVar87 = uVar40 + uVar30;
  iVar88 = uVar42 + uVar33;
  iVar45 = uVar22 - uVar35;
  iVar46 = uVar27 - uVar38;
  iVar47 = uVar30 - uVar40;
  iVar48 = uVar33 - uVar42;
  iVar52 = auVar13._0_4_ + auVar2._0_4_ + iVar90 >> 0xc;
  iVar54 = auVar13._4_4_ + auVar2._4_4_ + iVar96 >> 0xc;
  iVar56 = auVar13._8_4_ + auVar2._8_4_ + iVar99 >> 0xc;
  iVar101 = auVar13._12_4_ + auVar2._12_4_ + iVar103 >> 0xc;
  iVar37 = auVar5._0_4_ + auVar3._0_4_ + iVar90 >> 0xc;
  iVar39 = auVar5._4_4_ + auVar3._4_4_ + iVar96 >> 0xc;
  iVar41 = auVar5._8_4_ + auVar3._8_4_ + iVar99 >> 0xc;
  iVar79 = auVar5._12_4_ + auVar3._12_4_ + iVar103 >> 0xc;
  iVar26 = iVar37 + iVar52;
  iVar29 = iVar39 + iVar54;
  iVar32 = iVar41 + iVar56;
  iVar34 = iVar79 + iVar101;
  iVar52 = iVar52 - iVar37;
  iVar54 = iVar54 - iVar39;
  iVar56 = iVar56 - iVar41;
  iVar101 = iVar101 - iVar79;
  iVar37 = (auVar4._0_4_ - auVar6._0_4_) + iVar90 >> 0xc;
  iVar39 = (auVar4._4_4_ - auVar6._4_4_) + iVar96 >> 0xc;
  iVar41 = (auVar4._8_4_ - auVar6._8_4_) + iVar99 >> 0xc;
  iVar79 = (auVar4._12_4_ - auVar6._12_4_) + iVar103 >> 0xc;
  iVar94 = (auVar12._0_4_ - auVar8._0_4_) + iVar90 >> 0xc;
  iVar97 = (auVar12._4_4_ - auVar8._4_4_) + iVar96 >> 0xc;
  iVar100 = (auVar12._8_4_ - auVar8._8_4_) + iVar99 >> 0xc;
  iVar43 = (auVar12._12_4_ - auVar8._12_4_) + iVar103 >> 0xc;
  iVar81 = iVar94 + iVar37;
  iVar82 = iVar97 + iVar39;
  iVar83 = iVar100 + iVar41;
  iVar84 = iVar43 + iVar79;
  iVar37 = iVar37 - iVar94;
  iVar39 = iVar39 - iVar97;
  iVar41 = iVar41 - iVar100;
  iVar79 = iVar79 - iVar43;
  uVar35 = (uint)(iVar16 < iVar25) * iVar25 | (uint)(iVar16 >= iVar25) * iVar16;
  uVar38 = (uint)(iVar17 < iVar25) * iVar25 | (uint)(iVar17 >= iVar25) * iVar17;
  uVar40 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar42 = (uint)(iVar21 < iVar25) * iVar25 | (uint)(iVar21 >= iVar25) * iVar21;
  auVar2._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar2._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar2._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar2._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar35 = (uint)(iVar45 < iVar25) * iVar25 | (uint)(iVar45 >= iVar25) * iVar45;
  uVar38 = (uint)(iVar46 < iVar25) * iVar25 | (uint)(iVar46 >= iVar25) * iVar46;
  uVar40 = (uint)(iVar47 < iVar25) * iVar25 | (uint)(iVar47 >= iVar25) * iVar47;
  uVar42 = (uint)(iVar48 < iVar25) * iVar25 | (uint)(iVar48 >= iVar25) * iVar48;
  auVar8._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar8._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar8._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar8._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  auVar6._8_4_ = 0xb50;
  auVar6._0_8_ = 0xb5000000b50;
  auVar6._12_4_ = 0xb50;
  auVar2 = pmulld(auVar2,auVar6);
  auVar5 = pmulld(auVar8,auVar6);
  uVar35 = (uint)(iVar52 < iVar25) * iVar25 | (uint)(iVar52 >= iVar25) * iVar52;
  uVar38 = (uint)(iVar54 < iVar25) * iVar25 | (uint)(iVar54 >= iVar25) * iVar54;
  uVar40 = (uint)(iVar56 < iVar25) * iVar25 | (uint)(iVar56 >= iVar25) * iVar56;
  uVar42 = (uint)(iVar101 < iVar25) * iVar25 | (uint)(iVar101 >= iVar25) * iVar101;
  auVar18._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar18._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar18._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar18._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar35 = (uint)(iVar37 < iVar25) * iVar25 | (uint)(iVar37 >= iVar25) * iVar37;
  uVar38 = (uint)(iVar39 < iVar25) * iVar25 | (uint)(iVar39 >= iVar25) * iVar39;
  uVar40 = (uint)(iVar41 < iVar25) * iVar25 | (uint)(iVar41 >= iVar25) * iVar41;
  uVar42 = (uint)(iVar79 < iVar25) * iVar25 | (uint)(iVar79 >= iVar25) * iVar79;
  auVar4._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar4._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar4._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar4._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  auVar8 = pmulld(auVar18,auVar6);
  auVar3 = pmulld(auVar4,auVar6);
  uVar35 = (uint)(iVar28 < iVar25) * iVar25 | (uint)(iVar28 >= iVar25) * iVar28;
  uVar38 = (uint)(iVar31 < iVar25) * iVar25 | (uint)(iVar31 >= iVar25) * iVar31;
  uVar40 = (uint)(iVar11 < iVar25) * iVar25 | (uint)(iVar11 >= iVar25) * iVar11;
  uVar42 = (uint)(iVar15 < iVar25) * iVar25 | (uint)(iVar15 >= iVar25) * iVar15;
  uVar35 = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  uVar38 = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  uVar40 = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  uVar42 = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar22 = (uint)(iVar85 < iVar25) * iVar25 | (uint)(iVar85 >= iVar25) * iVar85;
  uVar27 = (uint)(iVar86 < iVar25) * iVar25 | (uint)(iVar86 >= iVar25) * iVar86;
  uVar30 = (uint)(iVar87 < iVar25) * iVar25 | (uint)(iVar87 >= iVar25) * iVar87;
  uVar33 = (uint)(iVar88 < iVar25) * iVar25 | (uint)(iVar88 >= iVar25) * iVar88;
  uVar64 = (uint)(iVar20 < (int)uVar22) * iVar20 | (iVar20 >= (int)uVar22) * uVar22;
  uVar67 = (uint)(iVar20 < (int)uVar27) * iVar20 | (iVar20 >= (int)uVar27) * uVar27;
  uVar69 = (uint)(iVar20 < (int)uVar30) * iVar20 | (iVar20 >= (int)uVar30) * uVar30;
  uVar71 = (uint)(iVar20 < (int)uVar33) * iVar20 | (iVar20 >= (int)uVar33) * uVar33;
  uVar22 = (uint)(iVar26 < iVar25) * iVar25 | (uint)(iVar26 >= iVar25) * iVar26;
  uVar27 = (uint)(iVar29 < iVar25) * iVar25 | (uint)(iVar29 >= iVar25) * iVar29;
  uVar30 = (uint)(iVar32 < iVar25) * iVar25 | (uint)(iVar32 >= iVar25) * iVar32;
  uVar33 = (uint)(iVar34 < iVar25) * iVar25 | (uint)(iVar34 >= iVar25) * iVar34;
  uVar22 = (uint)(iVar20 < (int)uVar22) * iVar20 | (iVar20 >= (int)uVar22) * uVar22;
  uVar27 = (uint)(iVar20 < (int)uVar27) * iVar20 | (iVar20 >= (int)uVar27) * uVar27;
  uVar30 = (uint)(iVar20 < (int)uVar30) * iVar20 | (iVar20 >= (int)uVar30) * uVar30;
  uVar33 = (uint)(iVar20 < (int)uVar33) * iVar20 | (iVar20 >= (int)uVar33) * uVar33;
  uVar49 = (uint)(iVar81 < iVar25) * iVar25 | (uint)(iVar81 >= iVar25) * iVar81;
  uVar53 = (uint)(iVar82 < iVar25) * iVar25 | (uint)(iVar82 >= iVar25) * iVar82;
  uVar55 = (uint)(iVar83 < iVar25) * iVar25 | (uint)(iVar83 >= iVar25) * iVar83;
  uVar57 = (uint)(iVar84 < iVar25) * iVar25 | (uint)(iVar84 >= iVar25) * iVar84;
  uVar49 = (uint)(iVar20 < (int)uVar49) * iVar20 | (iVar20 >= (int)uVar49) * uVar49;
  uVar53 = (uint)(iVar20 < (int)uVar53) * iVar20 | (iVar20 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar20 < (int)uVar55) * iVar20 | (iVar20 >= (int)uVar55) * uVar55;
  uVar57 = (uint)(iVar20 < (int)uVar57) * iVar20 | (iVar20 >= (int)uVar57) * uVar57;
  iVar16 = auVar5._0_4_ + auVar2._0_4_ + iVar90 >> 0xc;
  iVar17 = auVar5._4_4_ + auVar2._4_4_ + iVar96 >> 0xc;
  iVar19 = auVar5._8_4_ + auVar2._8_4_ + iVar99 >> 0xc;
  iVar21 = auVar5._12_4_ + auVar2._12_4_ + iVar103 >> 0xc;
  iVar28 = (auVar2._0_4_ - auVar5._0_4_) + iVar90 >> 0xc;
  iVar31 = (auVar2._4_4_ - auVar5._4_4_) + iVar96 >> 0xc;
  iVar11 = (auVar2._8_4_ - auVar5._8_4_) + iVar99 >> 0xc;
  iVar15 = (auVar2._12_4_ - auVar5._12_4_) + iVar103 >> 0xc;
  iVar26 = auVar3._0_4_ + auVar8._0_4_ + iVar90 >> 0xc;
  iVar29 = auVar3._4_4_ + auVar8._4_4_ + iVar96 >> 0xc;
  iVar32 = auVar3._8_4_ + auVar8._8_4_ + iVar99 >> 0xc;
  iVar34 = auVar3._12_4_ + auVar8._12_4_ + iVar103 >> 0xc;
  iVar37 = (auVar8._0_4_ - auVar3._0_4_) + iVar90 >> 0xc;
  iVar39 = (auVar8._4_4_ - auVar3._4_4_) + iVar96 >> 0xc;
  iVar41 = (auVar8._8_4_ - auVar3._8_4_) + iVar99 >> 0xc;
  iVar79 = (auVar8._12_4_ - auVar3._12_4_) + iVar103 >> 0xc;
  if (bit == 0) {
    bVar1 = 10;
    if (10 < do_cols) {
      bVar1 = (byte)do_cols;
    }
    iVar82 = 0x20 << (bVar1 & 0x1f);
    iVar81 = -iVar82;
    iVar82 = iVar82 + -1;
    iVar87 = (1 << ((byte)bd & 0x1f)) >> 1;
    auVar2 = ZEXT416((uint)bd);
    iVar83 = (int)(uVar35 + iVar87) >> auVar2;
    iVar84 = (int)(uVar38 + iVar87) >> auVar2;
    iVar85 = (int)(uVar40 + iVar87) >> auVar2;
    iVar86 = (int)(uVar42 + iVar87) >> auVar2;
    iVar88 = (int)(iVar87 - uVar22) >> auVar2;
    iVar94 = (int)(iVar87 - uVar27) >> auVar2;
    iVar97 = (int)(iVar87 - uVar30) >> auVar2;
    iVar100 = (int)(iVar87 - uVar33) >> auVar2;
    uVar35 = (uint)(iVar83 < iVar81) * iVar81 | (uint)(iVar83 >= iVar81) * iVar83;
    uVar38 = (uint)(iVar84 < iVar81) * iVar81 | (uint)(iVar84 >= iVar81) * iVar84;
    uVar40 = (uint)(iVar85 < iVar81) * iVar81 | (uint)(iVar85 >= iVar81) * iVar85;
    uVar42 = (uint)(iVar86 < iVar81) * iVar81 | (uint)(iVar86 >= iVar81) * iVar86;
    uVar22 = (uint)(iVar88 < iVar81) * iVar81 | (uint)(iVar88 >= iVar81) * iVar88;
    uVar27 = (uint)(iVar94 < iVar81) * iVar81 | (uint)(iVar94 >= iVar81) * iVar94;
    uVar30 = (uint)(iVar97 < iVar81) * iVar81 | (uint)(iVar97 >= iVar81) * iVar97;
    uVar33 = (uint)(iVar100 < iVar81) * iVar81 | (uint)(iVar100 >= iVar81) * iVar100;
    *(uint *)*out = (uint)(iVar82 < (int)uVar35) * iVar82 | (iVar82 >= (int)uVar35) * uVar35;
    *(uint *)((long)*out + 4) =
         (uint)(iVar82 < (int)uVar38) * iVar82 | (iVar82 >= (int)uVar38) * uVar38;
    *(uint *)(*out + 1) = (uint)(iVar82 < (int)uVar40) * iVar82 | (iVar82 >= (int)uVar40) * uVar40;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar82 < (int)uVar42) * iVar82 | (iVar82 >= (int)uVar42) * uVar42;
    iVar26 = iVar26 + iVar87 >> auVar2;
    iVar29 = iVar29 + iVar87 >> auVar2;
    iVar32 = iVar32 + iVar87 >> auVar2;
    iVar34 = iVar34 + iVar87 >> auVar2;
    iVar16 = iVar87 - iVar16 >> auVar2;
    iVar17 = iVar87 - iVar17 >> auVar2;
    iVar19 = iVar87 - iVar19 >> auVar2;
    iVar21 = iVar87 - iVar21 >> auVar2;
    *(uint *)out[2] = (uint)(iVar82 < (int)uVar22) * iVar82 | (iVar82 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[2] + 4) =
         (uint)(iVar82 < (int)uVar27) * iVar82 | (iVar82 >= (int)uVar27) * uVar27;
    *(uint *)(out[2] + 1) = (uint)(iVar82 < (int)uVar30) * iVar82 | (iVar82 >= (int)uVar30) * uVar30
    ;
    *(uint *)((long)out[2] + 0xc) =
         (uint)(iVar82 < (int)uVar33) * iVar82 | (iVar82 >= (int)uVar33) * uVar33;
    uVar22 = (uint)(iVar26 < iVar81) * iVar81 | (uint)(iVar26 >= iVar81) * iVar26;
    uVar27 = (uint)(iVar29 < iVar81) * iVar81 | (uint)(iVar29 >= iVar81) * iVar29;
    uVar30 = (uint)(iVar32 < iVar81) * iVar81 | (uint)(iVar32 >= iVar81) * iVar32;
    uVar33 = (uint)(iVar34 < iVar81) * iVar81 | (uint)(iVar34 >= iVar81) * iVar34;
    uVar35 = (uint)(iVar16 < iVar81) * iVar81 | (uint)(iVar16 >= iVar81) * iVar16;
    uVar38 = (uint)(iVar17 < iVar81) * iVar81 | (uint)(iVar17 >= iVar81) * iVar17;
    uVar40 = (uint)(iVar19 < iVar81) * iVar81 | (uint)(iVar19 >= iVar81) * iVar19;
    uVar42 = (uint)(iVar21 < iVar81) * iVar81 | (uint)(iVar21 >= iVar81) * iVar21;
    *(uint *)out[4] = (uint)(iVar82 < (int)uVar22) * iVar82 | (iVar82 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[4] + 4) =
         (uint)(iVar82 < (int)uVar27) * iVar82 | (iVar82 >= (int)uVar27) * uVar27;
    *(uint *)(out[4] + 1) = (uint)(iVar82 < (int)uVar30) * iVar82 | (iVar82 >= (int)uVar30) * uVar30
    ;
    *(uint *)((long)out[4] + 0xc) =
         (uint)(iVar82 < (int)uVar33) * iVar82 | (iVar82 >= (int)uVar33) * uVar33;
    *(uint *)out[6] = (uint)(iVar82 < (int)uVar35) * iVar82 | (iVar82 >= (int)uVar35) * uVar35;
    *(uint *)((long)out[6] + 4) =
         (uint)(iVar82 < (int)uVar38) * iVar82 | (iVar82 >= (int)uVar38) * uVar38;
    *(uint *)(out[6] + 1) = (uint)(iVar82 < (int)uVar40) * iVar82 | (iVar82 >= (int)uVar40) * uVar40
    ;
    *(uint *)((long)out[6] + 0xc) =
         (uint)(iVar82 < (int)uVar42) * iVar82 | (iVar82 >= (int)uVar42) * uVar42;
    iVar16 = iVar28 + iVar87 >> auVar2;
    iVar17 = iVar31 + iVar87 >> auVar2;
    iVar19 = iVar11 + iVar87 >> auVar2;
    iVar21 = iVar15 + iVar87 >> auVar2;
    iVar28 = iVar87 - iVar37 >> auVar2;
    iVar31 = iVar87 - iVar39 >> auVar2;
    iVar11 = iVar87 - iVar41 >> auVar2;
    iVar15 = iVar87 - iVar79 >> auVar2;
    uVar22 = (uint)(iVar16 < iVar81) * iVar81 | (uint)(iVar16 >= iVar81) * iVar16;
    uVar27 = (uint)(iVar17 < iVar81) * iVar81 | (uint)(iVar17 >= iVar81) * iVar17;
    uVar30 = (uint)(iVar19 < iVar81) * iVar81 | (uint)(iVar19 >= iVar81) * iVar19;
    uVar33 = (uint)(iVar21 < iVar81) * iVar81 | (uint)(iVar21 >= iVar81) * iVar21;
    uVar35 = (uint)(iVar28 < iVar81) * iVar81 | (uint)(iVar28 >= iVar81) * iVar28;
    uVar38 = (uint)(iVar31 < iVar81) * iVar81 | (uint)(iVar31 >= iVar81) * iVar31;
    uVar40 = (uint)(iVar11 < iVar81) * iVar81 | (uint)(iVar11 >= iVar81) * iVar11;
    uVar42 = (uint)(iVar15 < iVar81) * iVar81 | (uint)(iVar15 >= iVar81) * iVar15;
    *(uint *)out[8] = (uint)(iVar82 < (int)uVar22) * iVar82 | (iVar82 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[8] + 4) =
         (uint)(iVar82 < (int)uVar27) * iVar82 | (iVar82 >= (int)uVar27) * uVar27;
    *(uint *)(out[8] + 1) = (uint)(iVar82 < (int)uVar30) * iVar82 | (iVar82 >= (int)uVar30) * uVar30
    ;
    *(uint *)((long)out[8] + 0xc) =
         (uint)(iVar82 < (int)uVar33) * iVar82 | (iVar82 >= (int)uVar33) * uVar33;
    *(uint *)out[10] = (uint)(iVar82 < (int)uVar35) * iVar82 | (iVar82 >= (int)uVar35) * uVar35;
    *(uint *)((long)out[10] + 4) =
         (uint)(iVar82 < (int)uVar38) * iVar82 | (iVar82 >= (int)uVar38) * uVar38;
    *(uint *)(out[10] + 1) =
         (uint)(iVar82 < (int)uVar40) * iVar82 | (iVar82 >= (int)uVar40) * uVar40;
    *(uint *)((long)out[10] + 0xc) =
         (uint)(iVar82 < (int)uVar42) * iVar82 | (iVar82 >= (int)uVar42) * uVar42;
    iVar28 = (int)(uVar49 + iVar87) >> auVar2;
    iVar31 = (int)(uVar53 + iVar87) >> auVar2;
    iVar11 = (int)(uVar55 + iVar87) >> auVar2;
    iVar15 = (int)(uVar57 + iVar87) >> auVar2;
    iVar16 = (int)(iVar87 - uVar64) >> auVar2;
    iVar17 = (int)(iVar87 - uVar67) >> auVar2;
    iVar19 = (int)(iVar87 - uVar69) >> auVar2;
    iVar21 = (int)(iVar87 - uVar71) >> auVar2;
    uVar35 = (uint)(iVar28 < iVar81) * iVar81 | (uint)(iVar28 >= iVar81) * iVar28;
    uVar38 = (uint)(iVar31 < iVar81) * iVar81 | (uint)(iVar31 >= iVar81) * iVar31;
    uVar40 = (uint)(iVar11 < iVar81) * iVar81 | (uint)(iVar11 >= iVar81) * iVar11;
    uVar42 = (uint)(iVar15 < iVar81) * iVar81 | (uint)(iVar15 >= iVar81) * iVar15;
    uVar22 = (uint)(iVar16 < iVar81) * iVar81 | (uint)(iVar16 >= iVar81) * iVar16;
    uVar27 = (uint)(iVar17 < iVar81) * iVar81 | (uint)(iVar17 >= iVar81) * iVar17;
    uVar30 = (uint)(iVar19 < iVar81) * iVar81 | (uint)(iVar19 >= iVar81) * iVar19;
    uVar33 = (uint)(iVar21 < iVar81) * iVar81 | (uint)(iVar21 >= iVar81) * iVar21;
    *(uint *)out[0xc] = (uint)(iVar82 < (int)uVar35) * iVar82 | (iVar82 >= (int)uVar35) * uVar35;
    *(uint *)((long)out[0xc] + 4) =
         (uint)(iVar82 < (int)uVar38) * iVar82 | (iVar82 >= (int)uVar38) * uVar38;
    *(uint *)(out[0xc] + 1) =
         (uint)(iVar82 < (int)uVar40) * iVar82 | (iVar82 >= (int)uVar40) * uVar40;
    *(uint *)((long)out[0xc] + 0xc) =
         (uint)(iVar82 < (int)uVar42) * iVar82 | (iVar82 >= (int)uVar42) * uVar42;
    *(uint *)out[0xe] = (uint)(iVar82 < (int)uVar22) * iVar82 | (iVar82 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[0xe] + 4) =
         (uint)(iVar82 < (int)uVar27) * iVar82 | (iVar82 >= (int)uVar27) * uVar27;
    *(uint *)(out[0xe] + 1) =
         (uint)(iVar82 < (int)uVar30) * iVar82 | (iVar82 >= (int)uVar30) * uVar30;
    *(uint *)((long)out[0xe] + 0xc) =
         (uint)(iVar82 < (int)uVar33) * iVar82 | (iVar82 >= (int)uVar33) * uVar33;
  }
  else {
    *(uint *)*out = uVar35;
    *(uint *)((long)*out + 4) = uVar38;
    *(uint *)(*out + 1) = uVar40;
    *(uint *)((long)*out + 0xc) = uVar42;
    *(uint *)out[2] = -uVar22;
    *(uint *)((long)out[2] + 4) = -uVar27;
    *(uint *)(out[2] + 1) = -uVar30;
    *(uint *)((long)out[2] + 0xc) = -uVar33;
    *(int *)out[4] = iVar26;
    *(int *)((long)out[4] + 4) = iVar29;
    *(int *)(out[4] + 1) = iVar32;
    *(int *)((long)out[4] + 0xc) = iVar34;
    *(int *)out[6] = -iVar16;
    *(int *)((long)out[6] + 4) = -iVar17;
    *(int *)(out[6] + 1) = -iVar19;
    *(int *)((long)out[6] + 0xc) = -iVar21;
    *(int *)out[8] = iVar28;
    *(int *)((long)out[8] + 4) = iVar31;
    *(int *)(out[8] + 1) = iVar11;
    *(int *)((long)out[8] + 0xc) = iVar15;
    *(int *)out[10] = -iVar37;
    *(int *)((long)out[10] + 4) = -iVar39;
    *(int *)(out[10] + 1) = -iVar41;
    *(int *)((long)out[10] + 0xc) = -iVar79;
    *(uint *)out[0xc] = uVar49;
    *(uint *)((long)out[0xc] + 4) = uVar53;
    *(uint *)(out[0xc] + 1) = uVar55;
    *(uint *)((long)out[0xc] + 0xc) = uVar57;
    *(uint *)out[0xe] = -uVar64;
    *(uint *)((long)out[0xe] + 4) = -uVar67;
    *(uint *)(out[0xe] + 1) = -uVar69;
    *(uint *)((long)out[0xe] + 0xc) = -uVar71;
  }
  auVar2 = pmulld((undefined1  [16])in[0xf],auVar14);
  auVar8 = pmulld(auVar14,(undefined1  [16])in[1]);
  auVar14 = pmulld((undefined1  [16])in[1],auVar78);
  auVar50 = pmulld((undefined1  [16])in[0xf],auVar78);
  auVar3 = pmulld((undefined1  [16])in[0xb],auVar24);
  auVar24 = pmulld(auVar24,(undefined1  [16])in[5]);
  auVar13 = pmulld((undefined1  [16])in[5],auVar51);
  auVar51 = pmulld((undefined1  [16])in[0xb],auVar51);
  auVar4 = pmulld((undefined1  [16])in[7],auVar59);
  auVar23 = pmulld(auVar59,(undefined1  [16])in[9]);
  auVar18 = pmulld((undefined1  [16])in[9],auVar66);
  auVar12 = pmulld((undefined1  [16])in[7],auVar66);
  auVar5 = pmulld((undefined1  [16])in[3],auVar74);
  auVar36 = pmulld(auVar74,(undefined1  [16])in[0xd]);
  auVar78 = pmulld((undefined1  [16])in[0xd],auVar44);
  auVar66 = pmulld((undefined1  [16])in[3],auVar44);
  iVar16 = auVar14._0_4_ + auVar2._0_4_ + iVar90 >> 0xc;
  iVar17 = auVar14._4_4_ + auVar2._4_4_ + iVar96 >> 0xc;
  iVar19 = auVar14._8_4_ + auVar2._8_4_ + iVar99 >> 0xc;
  iVar21 = auVar14._12_4_ + auVar2._12_4_ + iVar103 >> 0xc;
  iVar52 = (auVar50._0_4_ - auVar8._0_4_) + iVar90 >> 0xc;
  iVar54 = (auVar50._4_4_ - auVar8._4_4_) + iVar96 >> 0xc;
  iVar56 = (auVar50._8_4_ - auVar8._8_4_) + iVar99 >> 0xc;
  iVar101 = (auVar50._12_4_ - auVar8._12_4_) + iVar103 >> 0xc;
  iVar37 = auVar13._0_4_ + auVar3._0_4_ + iVar90 >> 0xc;
  iVar39 = auVar13._4_4_ + auVar3._4_4_ + iVar96 >> 0xc;
  iVar41 = auVar13._8_4_ + auVar3._8_4_ + iVar99 >> 0xc;
  iVar79 = auVar13._12_4_ + auVar3._12_4_ + iVar103 >> 0xc;
  iVar85 = (auVar51._0_4_ - auVar24._0_4_) + iVar90 >> 0xc;
  iVar86 = (auVar51._4_4_ - auVar24._4_4_) + iVar96 >> 0xc;
  iVar87 = (auVar51._8_4_ - auVar24._8_4_) + iVar99 >> 0xc;
  iVar88 = (auVar51._12_4_ - auVar24._12_4_) + iVar103 >> 0xc;
  iVar81 = auVar18._0_4_ + auVar4._0_4_ + iVar90 >> 0xc;
  iVar82 = auVar18._4_4_ + auVar4._4_4_ + iVar96 >> 0xc;
  iVar83 = auVar18._8_4_ + auVar4._8_4_ + iVar99 >> 0xc;
  iVar84 = auVar18._12_4_ + auVar4._12_4_ + iVar103 >> 0xc;
  iVar26 = (auVar12._0_4_ - auVar23._0_4_) + iVar90 >> 0xc;
  iVar29 = (auVar12._4_4_ - auVar23._4_4_) + iVar96 >> 0xc;
  iVar32 = (auVar12._8_4_ - auVar23._8_4_) + iVar99 >> 0xc;
  iVar34 = (auVar12._12_4_ - auVar23._12_4_) + iVar103 >> 0xc;
  iVar45 = auVar78._0_4_ + auVar5._0_4_ + iVar90 >> 0xc;
  iVar46 = auVar78._4_4_ + auVar5._4_4_ + iVar96 >> 0xc;
  iVar47 = auVar78._8_4_ + auVar5._8_4_ + iVar99 >> 0xc;
  iVar48 = auVar78._12_4_ + auVar5._12_4_ + iVar103 >> 0xc;
  iVar94 = (auVar66._0_4_ - auVar36._0_4_) + iVar90 >> 0xc;
  iVar97 = (auVar66._4_4_ - auVar36._4_4_) + iVar96 >> 0xc;
  iVar100 = (auVar66._8_4_ - auVar36._8_4_) + iVar99 >> 0xc;
  iVar43 = (auVar66._12_4_ - auVar36._12_4_) + iVar103 >> 0xc;
  iVar28 = iVar81 + iVar16;
  iVar31 = iVar82 + iVar17;
  iVar11 = iVar83 + iVar19;
  iVar15 = iVar84 + iVar21;
  iVar16 = iVar16 - iVar81;
  iVar17 = iVar17 - iVar82;
  iVar19 = iVar19 - iVar83;
  iVar21 = iVar21 - iVar84;
  uVar35 = (uint)(iVar16 < iVar25) * iVar25 | (uint)(iVar16 >= iVar25) * iVar16;
  uVar38 = (uint)(iVar17 < iVar25) * iVar25 | (uint)(iVar17 >= iVar25) * iVar17;
  uVar40 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar42 = (uint)(iVar21 < iVar25) * iVar25 | (uint)(iVar21 >= iVar25) * iVar21;
  auVar36._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar36._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar36._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar36._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  iVar81 = iVar26 + iVar52;
  iVar82 = iVar29 + iVar54;
  iVar83 = iVar32 + iVar56;
  iVar84 = iVar34 + iVar101;
  iVar52 = iVar52 - iVar26;
  iVar54 = iVar54 - iVar29;
  iVar56 = iVar56 - iVar32;
  iVar101 = iVar101 - iVar34;
  uVar35 = (uint)(iVar52 < iVar25) * iVar25 | (uint)(iVar52 >= iVar25) * iVar52;
  uVar38 = (uint)(iVar54 < iVar25) * iVar25 | (uint)(iVar54 >= iVar25) * iVar54;
  uVar40 = (uint)(iVar56 < iVar25) * iVar25 | (uint)(iVar56 >= iVar25) * iVar56;
  uVar42 = (uint)(iVar101 < iVar25) * iVar25 | (uint)(iVar101 >= iVar25) * iVar101;
  auVar92._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar92._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar92._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar92._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  iVar16 = iVar45 + iVar37;
  iVar17 = iVar46 + iVar39;
  iVar19 = iVar47 + iVar41;
  iVar21 = iVar48 + iVar79;
  iVar37 = iVar37 - iVar45;
  iVar39 = iVar39 - iVar46;
  iVar41 = iVar41 - iVar47;
  iVar79 = iVar79 - iVar48;
  iVar26 = iVar94 + iVar85;
  iVar29 = iVar97 + iVar86;
  iVar32 = iVar100 + iVar87;
  iVar34 = iVar43 + iVar88;
  iVar85 = iVar85 - iVar94;
  iVar86 = iVar86 - iVar97;
  iVar87 = iVar87 - iVar100;
  iVar88 = iVar88 - iVar43;
  auVar5 = pmulld(auVar36,auVar9);
  auVar8 = pmulld(auVar9,auVar92);
  auVar24 = pmulld(auVar92,auVar10);
  auVar2 = pmulld(auVar36,auVar10);
  uVar35 = (uint)(iVar37 < iVar25) * iVar25 | (uint)(iVar37 >= iVar25) * iVar37;
  uVar38 = (uint)(iVar39 < iVar25) * iVar25 | (uint)(iVar39 >= iVar25) * iVar39;
  uVar40 = (uint)(iVar41 < iVar25) * iVar25 | (uint)(iVar41 >= iVar25) * iVar41;
  uVar42 = (uint)(iVar79 < iVar25) * iVar25 | (uint)(iVar79 >= iVar25) * iVar79;
  auVar80._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar80._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar80._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar80._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar35 = (uint)(iVar85 < iVar25) * iVar25 | (uint)(iVar85 >= iVar25) * iVar85;
  uVar38 = (uint)(iVar86 < iVar25) * iVar25 | (uint)(iVar86 >= iVar25) * iVar86;
  uVar40 = (uint)(iVar87 < iVar25) * iVar25 | (uint)(iVar87 >= iVar25) * iVar87;
  uVar42 = (uint)(iVar88 < iVar25) * iVar25 | (uint)(iVar88 >= iVar25) * iVar88;
  auVar91._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar91._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar91._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar91._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  auVar14 = pmulld(auVar80,auVar7);
  auVar7 = pmulld(auVar7,auVar91);
  auVar4 = pmulld(auVar91,auVar9);
  auVar3 = pmulld(auVar80,auVar9);
  uVar35 = (uint)(iVar28 < iVar25) * iVar25 | (uint)(iVar28 >= iVar25) * iVar28;
  uVar38 = (uint)(iVar31 < iVar25) * iVar25 | (uint)(iVar31 >= iVar25) * iVar31;
  uVar40 = (uint)(iVar11 < iVar25) * iVar25 | (uint)(iVar11 >= iVar25) * iVar11;
  uVar42 = (uint)(iVar15 < iVar25) * iVar25 | (uint)(iVar15 >= iVar25) * iVar15;
  uVar35 = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  uVar38 = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  uVar40 = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  uVar42 = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar22 = (uint)(iVar81 < iVar25) * iVar25 | (uint)(iVar81 >= iVar25) * iVar81;
  uVar27 = (uint)(iVar82 < iVar25) * iVar25 | (uint)(iVar82 >= iVar25) * iVar82;
  uVar30 = (uint)(iVar83 < iVar25) * iVar25 | (uint)(iVar83 >= iVar25) * iVar83;
  uVar33 = (uint)(iVar84 < iVar25) * iVar25 | (uint)(iVar84 >= iVar25) * iVar84;
  uVar64 = (uint)(iVar20 < (int)uVar22) * iVar20 | (iVar20 >= (int)uVar22) * uVar22;
  uVar67 = (uint)(iVar20 < (int)uVar27) * iVar20 | (iVar20 >= (int)uVar27) * uVar27;
  uVar69 = (uint)(iVar20 < (int)uVar30) * iVar20 | (iVar20 >= (int)uVar30) * uVar30;
  uVar71 = (uint)(iVar20 < (int)uVar33) * iVar20 | (iVar20 >= (int)uVar33) * uVar33;
  uVar22 = (uint)(iVar16 < iVar25) * iVar25 | (uint)(iVar16 >= iVar25) * iVar16;
  uVar27 = (uint)(iVar17 < iVar25) * iVar25 | (uint)(iVar17 >= iVar25) * iVar17;
  uVar30 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar33 = (uint)(iVar21 < iVar25) * iVar25 | (uint)(iVar21 >= iVar25) * iVar21;
  uVar22 = (uint)(iVar20 < (int)uVar22) * iVar20 | (iVar20 >= (int)uVar22) * uVar22;
  uVar27 = (uint)(iVar20 < (int)uVar27) * iVar20 | (iVar20 >= (int)uVar27) * uVar27;
  uVar30 = (uint)(iVar20 < (int)uVar30) * iVar20 | (iVar20 >= (int)uVar30) * uVar30;
  uVar33 = (uint)(iVar20 < (int)uVar33) * iVar20 | (iVar20 >= (int)uVar33) * uVar33;
  uVar49 = (uint)(iVar26 < iVar25) * iVar25 | (uint)(iVar26 >= iVar25) * iVar26;
  uVar53 = (uint)(iVar29 < iVar25) * iVar25 | (uint)(iVar29 >= iVar25) * iVar29;
  uVar55 = (uint)(iVar32 < iVar25) * iVar25 | (uint)(iVar32 >= iVar25) * iVar32;
  uVar57 = (uint)(iVar34 < iVar25) * iVar25 | (uint)(iVar34 >= iVar25) * iVar34;
  uVar49 = (uint)(iVar20 < (int)uVar49) * iVar20 | (iVar20 >= (int)uVar49) * uVar49;
  uVar53 = (uint)(iVar20 < (int)uVar53) * iVar20 | (iVar20 >= (int)uVar53) * uVar53;
  uVar55 = (uint)(iVar20 < (int)uVar55) * iVar20 | (iVar20 >= (int)uVar55) * uVar55;
  uVar57 = (uint)(iVar20 < (int)uVar57) * iVar20 | (iVar20 >= (int)uVar57) * uVar57;
  iVar52 = auVar24._0_4_ + auVar5._0_4_ + iVar90 >> 0xc;
  iVar54 = auVar24._4_4_ + auVar5._4_4_ + iVar96 >> 0xc;
  iVar56 = auVar24._8_4_ + auVar5._8_4_ + iVar99 >> 0xc;
  iVar101 = auVar24._12_4_ + auVar5._12_4_ + iVar103 >> 0xc;
  iVar16 = (auVar2._0_4_ - auVar8._0_4_) + iVar90 >> 0xc;
  iVar17 = (auVar2._4_4_ - auVar8._4_4_) + iVar96 >> 0xc;
  iVar19 = (auVar2._8_4_ - auVar8._8_4_) + iVar99 >> 0xc;
  iVar21 = (auVar2._12_4_ - auVar8._12_4_) + iVar103 >> 0xc;
  iVar81 = auVar4._0_4_ + auVar14._0_4_ + iVar90 >> 0xc;
  iVar82 = auVar4._4_4_ + auVar14._4_4_ + iVar96 >> 0xc;
  iVar83 = auVar4._8_4_ + auVar14._8_4_ + iVar99 >> 0xc;
  iVar84 = auVar4._12_4_ + auVar14._12_4_ + iVar103 >> 0xc;
  iVar37 = (auVar3._0_4_ - auVar7._0_4_) + iVar90 >> 0xc;
  iVar39 = (auVar3._4_4_ - auVar7._4_4_) + iVar96 >> 0xc;
  iVar41 = (auVar3._8_4_ - auVar7._8_4_) + iVar99 >> 0xc;
  iVar79 = (auVar3._12_4_ - auVar7._12_4_) + iVar103 >> 0xc;
  iVar94 = uVar22 + uVar35;
  iVar97 = uVar27 + uVar38;
  iVar100 = uVar30 + uVar40;
  iVar43 = uVar33 + uVar42;
  iVar28 = uVar35 - uVar22;
  iVar31 = uVar38 - uVar27;
  iVar11 = uVar40 - uVar30;
  iVar15 = uVar42 - uVar33;
  iVar26 = uVar49 + uVar64;
  iVar29 = uVar53 + uVar67;
  iVar32 = uVar55 + uVar69;
  iVar34 = uVar57 + uVar71;
  iVar85 = uVar64 - uVar49;
  iVar86 = uVar67 - uVar53;
  iVar87 = uVar69 - uVar55;
  iVar88 = uVar71 - uVar57;
  iVar45 = iVar81 + iVar52;
  iVar46 = iVar82 + iVar54;
  iVar47 = iVar83 + iVar56;
  iVar48 = iVar84 + iVar101;
  iVar52 = iVar52 - iVar81;
  iVar54 = iVar54 - iVar82;
  iVar56 = iVar56 - iVar83;
  iVar101 = iVar101 - iVar84;
  iVar81 = iVar37 + iVar16;
  iVar82 = iVar39 + iVar17;
  iVar83 = iVar41 + iVar19;
  iVar84 = iVar79 + iVar21;
  iVar16 = iVar16 - iVar37;
  iVar17 = iVar17 - iVar39;
  iVar19 = iVar19 - iVar41;
  iVar21 = iVar21 - iVar79;
  uVar65 = (uint)(iVar94 < iVar25) * iVar25 | (uint)(iVar94 >= iVar25) * iVar94;
  uVar68 = (uint)(iVar97 < iVar25) * iVar25 | (uint)(iVar97 >= iVar25) * iVar97;
  uVar70 = (uint)(iVar100 < iVar25) * iVar25 | (uint)(iVar100 >= iVar25) * iVar100;
  uVar72 = (uint)(iVar43 < iVar25) * iVar25 | (uint)(iVar43 >= iVar25) * iVar43;
  uVar35 = (uint)(iVar28 < iVar25) * iVar25 | (uint)(iVar28 >= iVar25) * iVar28;
  uVar38 = (uint)(iVar31 < iVar25) * iVar25 | (uint)(iVar31 >= iVar25) * iVar31;
  uVar40 = (uint)(iVar11 < iVar25) * iVar25 | (uint)(iVar11 >= iVar25) * iVar11;
  uVar42 = (uint)(iVar15 < iVar25) * iVar25 | (uint)(iVar15 >= iVar25) * iVar15;
  uVar49 = (uint)(iVar26 < iVar25) * iVar25 | (uint)(iVar26 >= iVar25) * iVar26;
  uVar53 = (uint)(iVar29 < iVar25) * iVar25 | (uint)(iVar29 >= iVar25) * iVar29;
  uVar55 = (uint)(iVar32 < iVar25) * iVar25 | (uint)(iVar32 >= iVar25) * iVar32;
  uVar57 = (uint)(iVar34 < iVar25) * iVar25 | (uint)(iVar34 >= iVar25) * iVar34;
  uVar58 = (uint)(iVar85 < iVar25) * iVar25 | (uint)(iVar85 >= iVar25) * iVar85;
  uVar61 = (uint)(iVar86 < iVar25) * iVar25 | (uint)(iVar86 >= iVar25) * iVar86;
  uVar62 = (uint)(iVar87 < iVar25) * iVar25 | (uint)(iVar87 >= iVar25) * iVar87;
  uVar63 = (uint)(iVar88 < iVar25) * iVar25 | (uint)(iVar88 >= iVar25) * iVar88;
  uVar73 = (uint)(iVar45 < iVar25) * iVar25 | (uint)(iVar45 >= iVar25) * iVar45;
  uVar75 = (uint)(iVar46 < iVar25) * iVar25 | (uint)(iVar46 >= iVar25) * iVar46;
  uVar76 = (uint)(iVar47 < iVar25) * iVar25 | (uint)(iVar47 >= iVar25) * iVar47;
  uVar77 = (uint)(iVar48 < iVar25) * iVar25 | (uint)(iVar48 >= iVar25) * iVar48;
  uVar89 = (uint)(iVar52 < iVar25) * iVar25 | (uint)(iVar52 >= iVar25) * iVar52;
  uVar95 = (uint)(iVar54 < iVar25) * iVar25 | (uint)(iVar54 >= iVar25) * iVar54;
  uVar98 = (uint)(iVar56 < iVar25) * iVar25 | (uint)(iVar56 >= iVar25) * iVar56;
  uVar102 = (uint)(iVar101 < iVar25) * iVar25 | (uint)(iVar101 >= iVar25) * iVar101;
  uVar64 = (uint)(iVar81 < iVar25) * iVar25 | (uint)(iVar81 >= iVar25) * iVar81;
  uVar67 = (uint)(iVar82 < iVar25) * iVar25 | (uint)(iVar82 >= iVar25) * iVar82;
  uVar69 = (uint)(iVar83 < iVar25) * iVar25 | (uint)(iVar83 >= iVar25) * iVar83;
  uVar71 = (uint)(iVar84 < iVar25) * iVar25 | (uint)(iVar84 >= iVar25) * iVar84;
  uVar22 = (uint)(iVar16 < iVar25) * iVar25 | (uint)(iVar16 >= iVar25) * iVar16;
  uVar27 = (uint)(iVar17 < iVar25) * iVar25 | (uint)(iVar17 >= iVar25) * iVar17;
  uVar30 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar33 = (uint)(iVar21 < iVar25) * iVar25 | (uint)(iVar21 >= iVar25) * iVar21;
  uVar65 = (uint)(iVar20 < (int)uVar65) * iVar20 | (iVar20 >= (int)uVar65) * uVar65;
  uVar68 = (uint)(iVar20 < (int)uVar68) * iVar20 | (iVar20 >= (int)uVar68) * uVar68;
  uVar70 = (uint)(iVar20 < (int)uVar70) * iVar20 | (iVar20 >= (int)uVar70) * uVar70;
  uVar72 = (uint)(iVar20 < (int)uVar72) * iVar20 | (iVar20 >= (int)uVar72) * uVar72;
  auVar23._0_4_ = (uint)(iVar20 < (int)uVar35) * iVar20 | (iVar20 >= (int)uVar35) * uVar35;
  auVar23._4_4_ = (uint)(iVar20 < (int)uVar38) * iVar20 | (iVar20 >= (int)uVar38) * uVar38;
  auVar23._8_4_ = (uint)(iVar20 < (int)uVar40) * iVar20 | (iVar20 >= (int)uVar40) * uVar40;
  auVar23._12_4_ = (uint)(iVar20 < (int)uVar42) * iVar20 | (iVar20 >= (int)uVar42) * uVar42;
  uVar35 = (uint)(iVar20 < (int)uVar49) * iVar20 | (iVar20 >= (int)uVar49) * uVar49;
  uVar38 = (uint)(iVar20 < (int)uVar53) * iVar20 | (iVar20 >= (int)uVar53) * uVar53;
  uVar40 = (uint)(iVar20 < (int)uVar55) * iVar20 | (iVar20 >= (int)uVar55) * uVar55;
  uVar42 = (uint)(iVar20 < (int)uVar57) * iVar20 | (iVar20 >= (int)uVar57) * uVar57;
  auVar60._0_4_ = (uint)(iVar20 < (int)uVar58) * iVar20 | (iVar20 >= (int)uVar58) * uVar58;
  auVar60._4_4_ = (uint)(iVar20 < (int)uVar61) * iVar20 | (iVar20 >= (int)uVar61) * uVar61;
  auVar60._8_4_ = (uint)(iVar20 < (int)uVar62) * iVar20 | (iVar20 >= (int)uVar62) * uVar62;
  auVar60._12_4_ = (uint)(iVar20 < (int)uVar63) * iVar20 | (iVar20 >= (int)uVar63) * uVar63;
  uVar58 = (uint)(iVar20 < (int)uVar73) * iVar20 | (iVar20 >= (int)uVar73) * uVar73;
  uVar61 = (uint)(iVar20 < (int)uVar75) * iVar20 | (iVar20 >= (int)uVar75) * uVar75;
  uVar62 = (uint)(iVar20 < (int)uVar76) * iVar20 | (iVar20 >= (int)uVar76) * uVar76;
  uVar63 = (uint)(iVar20 < (int)uVar77) * iVar20 | (iVar20 >= (int)uVar77) * uVar77;
  auVar93._0_4_ = (uint)(iVar20 < (int)uVar89) * iVar20 | (iVar20 >= (int)uVar89) * uVar89;
  auVar93._4_4_ = (uint)(iVar20 < (int)uVar95) * iVar20 | (iVar20 >= (int)uVar95) * uVar95;
  auVar93._8_4_ = (uint)(iVar20 < (int)uVar98) * iVar20 | (iVar20 >= (int)uVar98) * uVar98;
  auVar93._12_4_ = (uint)(iVar20 < (int)uVar102) * iVar20 | (iVar20 >= (int)uVar102) * uVar102;
  uVar49 = (uint)(iVar20 < (int)uVar64) * iVar20 | (iVar20 >= (int)uVar64) * uVar64;
  uVar53 = (uint)(iVar20 < (int)uVar67) * iVar20 | (iVar20 >= (int)uVar67) * uVar67;
  uVar55 = (uint)(iVar20 < (int)uVar69) * iVar20 | (iVar20 >= (int)uVar69) * uVar69;
  uVar57 = (uint)(iVar20 < (int)uVar71) * iVar20 | (iVar20 >= (int)uVar71) * uVar71;
  auVar50._0_4_ = (uint)(iVar20 < (int)uVar22) * iVar20 | (iVar20 >= (int)uVar22) * uVar22;
  auVar50._4_4_ = (uint)(iVar20 < (int)uVar27) * iVar20 | (iVar20 >= (int)uVar27) * uVar27;
  auVar50._8_4_ = (uint)(iVar20 < (int)uVar30) * iVar20 | (iVar20 >= (int)uVar30) * uVar30;
  auVar50._12_4_ = (uint)(iVar20 < (int)uVar33) * iVar20 | (iVar20 >= (int)uVar33) * uVar33;
  auVar2 = pmulld(auVar23,auVar6);
  auVar4 = pmulld(auVar60,auVar6);
  auVar5 = pmulld(auVar93,auVar6);
  auVar3 = pmulld(auVar50,auVar6);
  iVar11 = auVar4._0_4_ + auVar2._0_4_ + iVar90 >> 0xc;
  iVar15 = auVar4._4_4_ + auVar2._4_4_ + iVar96 >> 0xc;
  iVar16 = auVar4._8_4_ + auVar2._8_4_ + iVar99 >> 0xc;
  iVar17 = auVar4._12_4_ + auVar2._12_4_ + iVar103 >> 0xc;
  iVar20 = (auVar2._0_4_ - auVar4._0_4_) + iVar90 >> 0xc;
  iVar25 = (auVar2._4_4_ - auVar4._4_4_) + iVar96 >> 0xc;
  iVar28 = (auVar2._8_4_ - auVar4._8_4_) + iVar99 >> 0xc;
  iVar31 = (auVar2._12_4_ - auVar4._12_4_) + iVar103 >> 0xc;
  iVar19 = auVar3._0_4_ + auVar5._0_4_ + iVar90 >> 0xc;
  iVar21 = auVar3._4_4_ + auVar5._4_4_ + iVar96 >> 0xc;
  iVar26 = auVar3._8_4_ + auVar5._8_4_ + iVar99 >> 0xc;
  iVar29 = auVar3._12_4_ + auVar5._12_4_ + iVar103 >> 0xc;
  iVar90 = (auVar5._0_4_ - auVar3._0_4_) + iVar90 >> 0xc;
  iVar96 = (auVar5._4_4_ - auVar3._4_4_) + iVar96 >> 0xc;
  iVar99 = (auVar5._8_4_ - auVar3._8_4_) + iVar99 >> 0xc;
  iVar103 = (auVar5._12_4_ - auVar3._12_4_) + iVar103 >> 0xc;
  if (bit == 0) {
    bVar1 = 10;
    if (10 < do_cols) {
      bVar1 = (byte)do_cols;
    }
    iVar32 = 0x20 << (bVar1 & 0x1f);
    iVar34 = -iVar32;
    iVar32 = iVar32 + -1;
    iVar37 = (1 << ((byte)bd & 0x1f)) >> 1;
    auVar2 = ZEXT416((uint)bd);
    iVar82 = (int)(uVar65 + iVar37) >> auVar2;
    iVar83 = (int)(uVar68 + iVar37) >> auVar2;
    iVar84 = (int)(uVar70 + iVar37) >> auVar2;
    iVar85 = (int)(uVar72 + iVar37) >> auVar2;
    iVar39 = (int)(iVar37 - uVar58) >> auVar2;
    iVar41 = (int)(iVar37 - uVar61) >> auVar2;
    iVar79 = (int)(iVar37 - uVar62) >> auVar2;
    iVar81 = (int)(iVar37 - uVar63) >> auVar2;
    uVar64 = (uint)(iVar82 < iVar34) * iVar34 | (uint)(iVar82 >= iVar34) * iVar82;
    uVar67 = (uint)(iVar83 < iVar34) * iVar34 | (uint)(iVar83 >= iVar34) * iVar83;
    uVar69 = (uint)(iVar84 < iVar34) * iVar34 | (uint)(iVar84 >= iVar34) * iVar84;
    uVar71 = (uint)(iVar85 < iVar34) * iVar34 | (uint)(iVar85 >= iVar34) * iVar85;
    uVar22 = (uint)(iVar39 < iVar34) * iVar34 | (uint)(iVar39 >= iVar34) * iVar39;
    uVar27 = (uint)(iVar41 < iVar34) * iVar34 | (uint)(iVar41 >= iVar34) * iVar41;
    uVar30 = (uint)(iVar79 < iVar34) * iVar34 | (uint)(iVar79 >= iVar34) * iVar79;
    uVar33 = (uint)(iVar81 < iVar34) * iVar34 | (uint)(iVar81 >= iVar34) * iVar81;
    *(uint *)out[1] = (uint)(iVar32 < (int)uVar64) * iVar32 | (iVar32 >= (int)uVar64) * uVar64;
    *(uint *)((long)out[1] + 4) =
         (uint)(iVar32 < (int)uVar67) * iVar32 | (iVar32 >= (int)uVar67) * uVar67;
    *(uint *)(out[1] + 1) = (uint)(iVar32 < (int)uVar69) * iVar32 | (iVar32 >= (int)uVar69) * uVar69
    ;
    *(uint *)((long)out[1] + 0xc) =
         (uint)(iVar32 < (int)uVar71) * iVar32 | (iVar32 >= (int)uVar71) * uVar71;
    iVar19 = iVar19 + iVar37 >> auVar2;
    iVar21 = iVar21 + iVar37 >> auVar2;
    iVar26 = iVar26 + iVar37 >> auVar2;
    iVar29 = iVar29 + iVar37 >> auVar2;
    iVar11 = iVar37 - iVar11 >> auVar2;
    iVar15 = iVar37 - iVar15 >> auVar2;
    iVar16 = iVar37 - iVar16 >> auVar2;
    iVar17 = iVar37 - iVar17 >> auVar2;
    *(uint *)out[3] = (uint)(iVar32 < (int)uVar22) * iVar32 | (iVar32 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[3] + 4) =
         (uint)(iVar32 < (int)uVar27) * iVar32 | (iVar32 >= (int)uVar27) * uVar27;
    *(uint *)(out[3] + 1) = (uint)(iVar32 < (int)uVar30) * iVar32 | (iVar32 >= (int)uVar30) * uVar30
    ;
    *(uint *)((long)out[3] + 0xc) =
         (uint)(iVar32 < (int)uVar33) * iVar32 | (iVar32 >= (int)uVar33) * uVar33;
    uVar22 = (uint)(iVar19 < iVar34) * iVar34 | (uint)(iVar19 >= iVar34) * iVar19;
    uVar27 = (uint)(iVar21 < iVar34) * iVar34 | (uint)(iVar21 >= iVar34) * iVar21;
    uVar30 = (uint)(iVar26 < iVar34) * iVar34 | (uint)(iVar26 >= iVar34) * iVar26;
    uVar33 = (uint)(iVar29 < iVar34) * iVar34 | (uint)(iVar29 >= iVar34) * iVar29;
    uVar64 = (uint)(iVar11 < iVar34) * iVar34 | (uint)(iVar11 >= iVar34) * iVar11;
    uVar67 = (uint)(iVar15 < iVar34) * iVar34 | (uint)(iVar15 >= iVar34) * iVar15;
    uVar69 = (uint)(iVar16 < iVar34) * iVar34 | (uint)(iVar16 >= iVar34) * iVar16;
    uVar71 = (uint)(iVar17 < iVar34) * iVar34 | (uint)(iVar17 >= iVar34) * iVar17;
    *(uint *)out[5] = (uint)(iVar32 < (int)uVar22) * iVar32 | (iVar32 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[5] + 4) =
         (uint)(iVar32 < (int)uVar27) * iVar32 | (iVar32 >= (int)uVar27) * uVar27;
    *(uint *)(out[5] + 1) = (uint)(iVar32 < (int)uVar30) * iVar32 | (iVar32 >= (int)uVar30) * uVar30
    ;
    *(uint *)((long)out[5] + 0xc) =
         (uint)(iVar32 < (int)uVar33) * iVar32 | (iVar32 >= (int)uVar33) * uVar33;
    *(uint *)out[7] = (uint)(iVar32 < (int)uVar64) * iVar32 | (iVar32 >= (int)uVar64) * uVar64;
    *(uint *)((long)out[7] + 4) =
         (uint)(iVar32 < (int)uVar67) * iVar32 | (iVar32 >= (int)uVar67) * uVar67;
    *(uint *)(out[7] + 1) = (uint)(iVar32 < (int)uVar69) * iVar32 | (iVar32 >= (int)uVar69) * uVar69
    ;
    *(uint *)((long)out[7] + 0xc) =
         (uint)(iVar32 < (int)uVar71) * iVar32 | (iVar32 >= (int)uVar71) * uVar71;
    iVar20 = iVar20 + iVar37 >> auVar2;
    iVar25 = iVar25 + iVar37 >> auVar2;
    iVar28 = iVar28 + iVar37 >> auVar2;
    iVar31 = iVar31 + iVar37 >> auVar2;
    iVar90 = iVar37 - iVar90 >> auVar2;
    iVar96 = iVar37 - iVar96 >> auVar2;
    iVar99 = iVar37 - iVar99 >> auVar2;
    iVar103 = iVar37 - iVar103 >> auVar2;
    uVar22 = (uint)(iVar20 < iVar34) * iVar34 | (uint)(iVar20 >= iVar34) * iVar20;
    uVar27 = (uint)(iVar25 < iVar34) * iVar34 | (uint)(iVar25 >= iVar34) * iVar25;
    uVar30 = (uint)(iVar28 < iVar34) * iVar34 | (uint)(iVar28 >= iVar34) * iVar28;
    uVar33 = (uint)(iVar31 < iVar34) * iVar34 | (uint)(iVar31 >= iVar34) * iVar31;
    uVar64 = (uint)(iVar90 < iVar34) * iVar34 | (uint)(iVar90 >= iVar34) * iVar90;
    uVar67 = (uint)(iVar96 < iVar34) * iVar34 | (uint)(iVar96 >= iVar34) * iVar96;
    uVar69 = (uint)(iVar99 < iVar34) * iVar34 | (uint)(iVar99 >= iVar34) * iVar99;
    uVar71 = (uint)(iVar103 < iVar34) * iVar34 | (uint)(iVar103 >= iVar34) * iVar103;
    *(uint *)out[9] = (uint)(iVar32 < (int)uVar22) * iVar32 | (iVar32 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[9] + 4) =
         (uint)(iVar32 < (int)uVar27) * iVar32 | (iVar32 >= (int)uVar27) * uVar27;
    *(uint *)(out[9] + 1) = (uint)(iVar32 < (int)uVar30) * iVar32 | (iVar32 >= (int)uVar30) * uVar30
    ;
    *(uint *)((long)out[9] + 0xc) =
         (uint)(iVar32 < (int)uVar33) * iVar32 | (iVar32 >= (int)uVar33) * uVar33;
    *(uint *)out[0xb] = (uint)(iVar32 < (int)uVar64) * iVar32 | (iVar32 >= (int)uVar64) * uVar64;
    *(uint *)((long)out[0xb] + 4) =
         (uint)(iVar32 < (int)uVar67) * iVar32 | (iVar32 >= (int)uVar67) * uVar67;
    *(uint *)(out[0xb] + 1) =
         (uint)(iVar32 < (int)uVar69) * iVar32 | (iVar32 >= (int)uVar69) * uVar69;
    *(uint *)((long)out[0xb] + 0xc) =
         (uint)(iVar32 < (int)uVar71) * iVar32 | (iVar32 >= (int)uVar71) * uVar71;
    iVar99 = (int)(uVar49 + iVar37) >> auVar2;
    iVar103 = (int)(uVar53 + iVar37) >> auVar2;
    iVar28 = (int)(uVar55 + iVar37) >> auVar2;
    iVar31 = (int)(uVar57 + iVar37) >> auVar2;
    iVar20 = (int)(iVar37 - uVar35) >> auVar2;
    iVar25 = (int)(iVar37 - uVar38) >> auVar2;
    iVar90 = (int)(iVar37 - uVar40) >> auVar2;
    iVar96 = (int)(iVar37 - uVar42) >> auVar2;
    uVar22 = (uint)(iVar99 < iVar34) * iVar34 | (uint)(iVar99 >= iVar34) * iVar99;
    uVar27 = (uint)(iVar103 < iVar34) * iVar34 | (uint)(iVar103 >= iVar34) * iVar103;
    uVar30 = (uint)(iVar28 < iVar34) * iVar34 | (uint)(iVar28 >= iVar34) * iVar28;
    uVar33 = (uint)(iVar31 < iVar34) * iVar34 | (uint)(iVar31 >= iVar34) * iVar31;
    uVar35 = (uint)(iVar20 < iVar34) * iVar34 | (uint)(iVar20 >= iVar34) * iVar20;
    uVar38 = (uint)(iVar25 < iVar34) * iVar34 | (uint)(iVar25 >= iVar34) * iVar25;
    uVar40 = (uint)(iVar90 < iVar34) * iVar34 | (uint)(iVar90 >= iVar34) * iVar90;
    uVar42 = (uint)(iVar96 < iVar34) * iVar34 | (uint)(iVar96 >= iVar34) * iVar96;
    *(uint *)out[0xd] = (uint)(iVar32 < (int)uVar22) * iVar32 | (iVar32 >= (int)uVar22) * uVar22;
    *(uint *)((long)out[0xd] + 4) =
         (uint)(iVar32 < (int)uVar27) * iVar32 | (iVar32 >= (int)uVar27) * uVar27;
    *(uint *)(out[0xd] + 1) =
         (uint)(iVar32 < (int)uVar30) * iVar32 | (iVar32 >= (int)uVar30) * uVar30;
    *(uint *)((long)out[0xd] + 0xc) =
         (uint)(iVar32 < (int)uVar33) * iVar32 | (iVar32 >= (int)uVar33) * uVar33;
    *(uint *)out[0xf] = (uint)(iVar32 < (int)uVar35) * iVar32 | (iVar32 >= (int)uVar35) * uVar35;
    *(uint *)((long)out[0xf] + 4) =
         (uint)(iVar32 < (int)uVar38) * iVar32 | (iVar32 >= (int)uVar38) * uVar38;
    *(uint *)(out[0xf] + 1) =
         (uint)(iVar32 < (int)uVar40) * iVar32 | (iVar32 >= (int)uVar40) * uVar40;
    *(uint *)((long)out[0xf] + 0xc) =
         (uint)(iVar32 < (int)uVar42) * iVar32 | (iVar32 >= (int)uVar42) * uVar42;
  }
  else {
    *(uint *)out[1] = uVar65;
    *(uint *)((long)out[1] + 4) = uVar68;
    *(uint *)(out[1] + 1) = uVar70;
    *(uint *)((long)out[1] + 0xc) = uVar72;
    *(uint *)out[3] = -uVar58;
    *(uint *)((long)out[3] + 4) = -uVar61;
    *(uint *)(out[3] + 1) = -uVar62;
    *(uint *)((long)out[3] + 0xc) = -uVar63;
    *(int *)out[5] = iVar19;
    *(int *)((long)out[5] + 4) = iVar21;
    *(int *)(out[5] + 1) = iVar26;
    *(int *)((long)out[5] + 0xc) = iVar29;
    *(int *)out[7] = -iVar11;
    *(int *)((long)out[7] + 4) = -iVar15;
    *(int *)(out[7] + 1) = -iVar16;
    *(int *)((long)out[7] + 0xc) = -iVar17;
    *(int *)out[9] = iVar20;
    *(int *)((long)out[9] + 4) = iVar25;
    *(int *)(out[9] + 1) = iVar28;
    *(int *)((long)out[9] + 0xc) = iVar31;
    *(int *)out[0xb] = -iVar90;
    *(int *)((long)out[0xb] + 4) = -iVar96;
    *(int *)(out[0xb] + 1) = -iVar99;
    *(int *)((long)out[0xb] + 0xc) = -iVar103;
    *(uint *)out[0xd] = uVar49;
    *(uint *)((long)out[0xd] + 4) = uVar53;
    *(uint *)(out[0xd] + 1) = uVar55;
    *(uint *)((long)out[0xd] + 0xc) = uVar57;
    *(uint *)out[0xf] = -uVar35;
    *(uint *)((long)out[0xf] + 4) = -uVar38;
    *(uint *)(out[0xf] + 1) = -uVar40;
    *(uint *)((long)out[0xf] + 0xc) = -uVar42;
  }
  return;
}

Assistant:

static void iadst8x8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                            int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // Even 8 points: 0, 2, ..., 14
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[14], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[14], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[10], cospi20);
  x = _mm_mullo_epi32(in[4], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[10], cospi44);
  x = _mm_mullo_epi32(in[4], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[6], cospi36);
  x = _mm_mullo_epi32(in[8], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[6], cospi28);
  x = _mm_mullo_epi32(in[8], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[2], cospi52);
  x = _mm_mullo_epi32(in[12], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[2], cospi12);
  x = _mm_mullo_epi32(in[12], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[2] = _mm_sub_epi32(kZero, u[4]);
    out[4] = u[6];
    out[6] = _mm_sub_epi32(kZero, u[2]);
    out[8] = u[3];
    out[10] = _mm_sub_epi32(kZero, u[7]);
    out[12] = u[5];
    out[14] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 2, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 4, out + 6, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 8, out + 10, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 12, out + 14, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }

  // Odd 8 points: 1, 3, ..., 15
  // stage 0
  // stage 1
  // stage 2
  // (1)
  u[0] = _mm_mullo_epi32(in[15], cospi4);
  x = _mm_mullo_epi32(in[1], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[15], cospi60);
  x = _mm_mullo_epi32(in[1], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[11], cospi20);
  x = _mm_mullo_epi32(in[5], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[11], cospi44);
  x = _mm_mullo_epi32(in[5], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[7], cospi36);
  x = _mm_mullo_epi32(in[9], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[7], cospi28);
  x = _mm_mullo_epi32(in[9], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[3], cospi52);
  x = _mm_mullo_epi32(in[13], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[3], cospi12);
  x = _mm_mullo_epi32(in[13], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[1] = u[0];
    out[3] = _mm_sub_epi32(kZero, u[4]);
    out[5] = u[6];
    out[7] = _mm_sub_epi32(kZero, u[2]);
    out[9] = u[3];
    out[11] = _mm_sub_epi32(kZero, u[7]);
    out[13] = u[5];
    out[15] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 1, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 5, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 9, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 13, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}